

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_main.c
# Opt level: O2

void namelist2gui(char *name,t_namelist *namelist)

{
  void *old;
  void *pvVar1;
  ulong uVar2;
  size_t oldsize;
  ulong uVar3;
  
  old = getbytes(0x100);
  uVar2 = 0x20;
  uVar3 = 0;
  for (; namelist != (t_namelist *)0x0; namelist = namelist->nl_next) {
    pvVar1 = old;
    if (uVar2 <= uVar3) {
      oldsize = uVar2 * 8;
      pvVar1 = resizebytes(old,oldsize,uVar2 * 8 + 0x100);
      if (pvVar1 == (void *)0x0) goto LAB_0016fcbf;
      uVar2 = uVar2 + 0x20;
    }
    *(char **)((long)pvVar1 + uVar3 * 8) = namelist->nl_string;
    uVar3 = uVar3 + 1;
    old = pvVar1;
  }
  oldsize = uVar2 << 3;
LAB_0016fcbf:
  pdgui_vmess("set","rS",name,uVar3 & 0xffffffff,old);
  freebytes(old,oldsize);
  return;
}

Assistant:

static void namelist2gui(const char*name, t_namelist*namelist)
{
    const size_t allocchunk = 32;
    int i;
    t_namelist *nl;

    size_t namesize = allocchunk;
    const char**names=(const char**)getbytes(namesize*sizeof(const char*));

    for (nl = namelist, i = 0; nl; nl = nl->nl_next, i++)
    {
        if(i>=namesize) {
            size_t newsize = namesize + allocchunk;
            const char**newnames = (const char**)resizebytes(
                names,
                namesize*sizeof(const char*),
                newsize*sizeof(const char*));
            if (!newnames)
                break;
            names = newnames;
            namesize = newsize;
        }
        names[i] = nl->nl_string;
    }
    pdgui_vmess("set", "rS",
              name,
              i, names);
    freebytes(names, namesize*sizeof(const char*));
}